

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
::find(optional<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_> *__return_storage_ptr__,
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
      *this,Key<30UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_&,_const_supermap::Key<30UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_&,_const_supermap::Key<30UL>_&)>
            *equal)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  KeyValue<supermap::Key<30UL>,_unsigned_long> firstLeqElem;
  KeyValue<supermap::Key<30UL>,_unsigned_long> local_58;
  
  iVar2 = (*(this->
            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
            ).
            super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
            .
            super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
            ._vptr_OrderedStorage[1])(this);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              ._vptr_OrderedStorage[1])(this);
    uVar3 = CONCAT44(extraout_var_00,iVar2);
    uVar4 = 0;
    while (uVar5 = uVar4, 1 < uVar3 - uVar5) {
      uVar4 = uVar3 + uVar5 >> 1;
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
        ._vptr_OrderedStorage[4])(&local_58,this,uVar4);
      bVar1 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_&,_const_supermap::Key<30UL>_&)>
              ::operator()(less,&local_58,pattern);
      if ((!bVar1) &&
         (bVar1 = std::
                  function<bool_(const_supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_&,_const_supermap::Key<30UL>_&)>
                  ::operator()(equal,&local_58,pattern), !bVar1)) {
        uVar3 = uVar4;
        uVar4 = uVar5;
      }
    }
    iVar2 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
              ._vptr_OrderedStorage[1])(this);
    if (uVar5 < CONCAT44(extraout_var_01,iVar2)) {
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
        ._vptr_OrderedStorage[4])(&local_58,this,uVar5);
      bVar1 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_&,_const_supermap::Key<30UL>_&)>
              ::operator()(equal,&local_58,pattern);
      if (bVar1) {
        (__return_storage_ptr__->
        super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
        _M_payload._M_value.value = local_58.value;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                 ._M_payload + 0x10) = local_58.key.super_array<unsigned_char,_30UL>._M_elems._16_8_
        ;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                 ._M_payload + 0x18) = local_58._24_8_;
        *(undefined8 *)
         &(__return_storage_ptr__->
          super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
          _M_payload = local_58.key.super_array<unsigned_char,_30UL>._M_elems._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>
                 ._M_payload + 8) = local_58.key.super_array<unsigned_char,_30UL>._M_elems._8_8_;
      }
      (__return_storage_ptr__->
      super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
      _M_engaged = bVar1;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_true,_true>).
  _M_payload.super__Optional_payload_base<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>_>.
  _M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }